

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[12],kj::StringPtr&,kj::StringPtr&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [12],StringPtr *params_1,
          StringPtr *params_2,char (*params_3) [2])

{
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  kj *local_40;
  size_t local_38;
  
  local_38 = strlen((char *)this);
  local_50.ptr = *(char **)*params;
  local_50.size_ = *(long *)(*params + 8) - 1;
  local_60.ptr = (params_1->content).ptr;
  local_60.size_ = (params_1->content).size_ - 1;
  local_40 = this;
  local_70.size_ = strlen((char *)params_2);
  local_70.ptr = (char *)params_2;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_60,&local_70,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}